

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int,_int,_int)>::Invoke
          (FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int,_int,_int)> *this,int args,
          int args_1,int args_2,int args_3,int args_4,int args_5,int args_6,int args_7,int args_8,
          int args_9)

{
  Result RVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<int> *pAVar2;
  int args_local_4;
  int args_local_3;
  int args_local_2;
  int args_local_1;
  int args_local;
  ArgumentTuple tuple;
  
  args_local_4 = args_4;
  args_local_3 = args_3;
  args_local_2 = args_2;
  args_local_1 = args_1;
  args_local = args;
  std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>::
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int,_true,_true>
            (&tuple,&args_local,&args_local_1,&args_local_2,&args_local_3,&args_local_4,&args_5,
             &args_6,&args_7,&args_8,&args_9);
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&tuple);
  pAVar2 = DownCast_<testing::internal::ActionResultHolder<int>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  RVar1 = (pAVar2->result_).value_;
  (*(pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar2);
  return RVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }